

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz_old.cpp
# Opt level: O0

void anon_unknown.dwarf_1a1211::scaleImage<(anonymous_namespace)::Scaler3x>
               (uint32_t *src,uint32_t *trg,int srcWidth,int srcHeight,ScalerCfg *cfg,int yFirst,
               int yLast)

{
  int iVar1;
  code *pcVar2;
  uint32_t *puVar3;
  ScalerCfg *pSVar4;
  int iVar5;
  uint32_t *puVar6;
  bool bVar7;
  BlendType BVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int *piVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  uint32_t local_634;
  uint32_t local_5fc;
  uint32_t local_5c4;
  bool local_5a1;
  bool local_58d;
  uint32_t local_58c;
  bool local_535;
  undefined1 local_494 [8];
  Kernel_3x3 ker_2;
  BlendResult res_1;
  Kernel_4x4 ker_1;
  int iStack_418;
  uchar blend_xy;
  int local_414;
  int local_410;
  int x_p2_1;
  int local_408;
  int local_404;
  int x_p1_1;
  int local_3fc;
  int local_3f8;
  int x_m1_1;
  int x_1;
  int iStack_3ec;
  uchar blend_xy1;
  uint32_t *local_3e8;
  uint32_t *s_p2_1;
  uint32_t *local_3d8;
  uint32_t *s_p1_1;
  uint32_t *s_0_1;
  uint32_t *local_3c0;
  uint32_t *s_m1_1;
  uint32_t *out;
  undefined8 uStack_3a8;
  int y_1;
  BlendResult res;
  Kernel_4x4 ker;
  int local_34c;
  int x_p2;
  int local_344;
  int local_340;
  int x_p1;
  int local_338;
  int local_334;
  int x_m1;
  int x;
  uint32_t *local_328;
  uint32_t *s_p2;
  uint32_t *local_318;
  uint32_t *s_p1;
  uint32_t *s_0;
  uint32_t *local_300;
  uint32_t *s_m1;
  int y;
  uchar *preProcBuffer;
  int bufferSize;
  int trgWidth;
  ScalerCfg *pSStack_2d8;
  int yFirst_local;
  ScalerCfg *cfg_local;
  int srcHeight_local;
  int srcWidth_local;
  uint32_t *trg_local;
  uint32_t *src_local;
  bool dominantGradient_3;
  double dStack_2b0;
  bool dominantGradient_2;
  double fk_1;
  double jg_1;
  anon_class_8_1_ba1d3bc4 aStack_298;
  int weight_1;
  anon_class_8_1_ba1d3bc4 dist_1;
  BlendType local_27c;
  uint32_t uStack_278;
  BlendResult result_1;
  bool dominantGradient_1;
  bool dominantGradient;
  double fk;
  double jg;
  anon_class_8_1_ba1d3bc4 aStack_250;
  int weight;
  anon_class_8_1_ba1d3bc4 dist;
  undefined4 local_234;
  undefined4 uStack_230;
  BlendResult result;
  bool haveSteepLine;
  bool haveShallowLine;
  double hc;
  double fg;
  OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0> out_1;
  undefined1 auStack_1f8 [4];
  uint32_t px;
  anon_class_8_1_ba1d3bc4 *local_1f0;
  Kernel_3x3 *local_1e8;
  byte local_1d9;
  anon_class_8_1_ba1d3bc4 aStack_1d8;
  bool doLineBlend;
  anon_class_8_1_ba1d3bc4 dist_2;
  anon_class_8_1_ba1d3bc4 eq;
  uchar blend;
  bool haveSteepLine_1;
  bool haveShallowLine_1;
  double hc_1;
  double fg_1;
  OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1> out_2;
  undefined1 auStack_170 [4];
  uint32_t px_1;
  anon_class_8_1_ba1d3bc4 *local_168;
  Kernel_3x3 *local_160;
  byte local_151;
  anon_class_8_1_ba1d3bc4 aStack_150;
  bool doLineBlend_1;
  anon_class_8_1_ba1d3bc4 dist_3;
  anon_class_8_1_ba1d3bc4 eq_1;
  uchar blend_1;
  bool haveSteepLine_2;
  bool haveShallowLine_2;
  double hc_2;
  double fg_2;
  OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2> out_3;
  undefined1 auStack_e8 [4];
  uint32_t px_2;
  anon_class_8_1_ba1d3bc4 *local_e0;
  Kernel_3x3 *local_d8;
  byte local_c9;
  anon_class_8_1_ba1d3bc4 aStack_c8;
  bool doLineBlend_2;
  anon_class_8_1_ba1d3bc4 dist_4;
  anon_class_8_1_ba1d3bc4 eq_2;
  uchar blend_2;
  bool haveSteepLine_3;
  bool haveShallowLine_3;
  double hc_3;
  double fg_3;
  OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3> out_4;
  undefined1 auStack_60 [4];
  uint32_t px_3;
  anon_class_8_1_ba1d3bc4 *local_58;
  Kernel_3x3 *local_50;
  byte local_41;
  anon_class_8_1_ba1d3bc4 aStack_40;
  bool doLineBlend_3;
  anon_class_8_1_ba1d3bc4 dist_5;
  anon_class_8_1_ba1d3bc4 eq_3;
  uchar blend_3;
  
  bufferSize = 0;
  trgWidth = yFirst;
  pSStack_2d8 = cfg;
  cfg_local._0_4_ = srcHeight;
  cfg_local._4_4_ = srcWidth;
  _srcHeight_local = trg;
  trg_local = src;
  piVar11 = std::max<int>(&trgWidth,&bufferSize);
  trgWidth = *piVar11;
  piVar11 = std::min<int>(&yLast,(int *)&cfg_local);
  yLast = *piVar11;
  if ((trgWidth < yLast) && (0 < cfg_local._4_4_)) {
    preProcBuffer._4_4_ = cfg_local._4_4_ * 3;
    preProcBuffer._0_4_ = cfg_local._4_4_;
    _y = (uchar *)((long)_srcHeight_local +
                  ((long)(yLast * 3 * preProcBuffer._4_4_) * 4 - (long)cfg_local._4_4_));
    s_m1._4_4_ = 0;
    std::fill<unsigned_char*,int>(_y,_y + cfg_local._4_4_,(int *)((long)&s_m1 + 4));
    puVar3 = trg_local;
    iVar1 = cfg_local._4_4_;
    if (0 < trgWidth) {
      s_m1._0_4_ = trgWidth + -1;
      s_0._4_4_ = trgWidth + -2;
      s_0._0_4_ = 0;
      piVar11 = std::max<int>((int *)((long)&s_0 + 4),(int *)&s_0);
      puVar6 = trg_local;
      iVar5 = cfg_local._4_4_;
      local_300 = puVar3 + iVar1 * *piVar11;
      s_p1 = trg_local + cfg_local._4_4_ * (int)s_m1;
      s_p2._4_4_ = (int)s_m1 + 1;
      s_p2._0_4_ = (int)cfg_local + -1;
      piVar11 = std::min<int>((int *)((long)&s_p2 + 4),(int *)&s_p2);
      puVar3 = trg_local;
      iVar1 = cfg_local._4_4_;
      local_318 = puVar6 + iVar5 * *piVar11;
      x = (int)s_m1 + 2;
      x_m1 = (int)cfg_local + -1;
      piVar11 = std::min<int>(&x,&x_m1);
      local_328 = puVar3 + iVar1 * *piVar11;
      for (local_334 = 0; local_334 < cfg_local._4_4_; local_334 = local_334 + 1) {
        x_p1 = local_334 + -1;
        local_340 = 0;
        piVar11 = std::max<int>(&x_p1,&local_340);
        local_338 = *piVar11;
        x_p2 = local_334 + 1;
        local_34c = cfg_local._4_4_ + -1;
        piVar11 = std::min<int>(&x_p2,&local_34c);
        local_344 = *piVar11;
        ker.p = local_334 + 2;
        ker.o = cfg_local._4_4_ - 1;
        piVar11 = std::min<int>((int *)&ker.p,(int *)&ker.o);
        iVar1 = *piVar11;
        memset(&res.blend_j,0,0x40);
        res.blend_j = local_300[local_338];
        res.blend_k = local_300[local_334];
        ker.a = local_300[local_344];
        ker.b = local_300[iVar1];
        ker.c = s_p1[local_338];
        ker.d = s_p1[local_334];
        ker.e = s_p1[local_344];
        ker.f = s_p1[iVar1];
        ker.g = local_318[local_338];
        ker.h = local_318[local_334];
        ker.i = local_318[local_344];
        ker.j = local_318[iVar1];
        ker.k = local_328[local_338];
        ker.l = local_328[local_334];
        ker.m = local_328[local_344];
        ker.n = local_328[iVar1];
        dist.cfg = pSStack_2d8;
        memset(&local_234,0,0x10);
        if (((ker.d != ker.e) || (ker.h != ker.i)) && ((ker.d != ker.h || (ker.e != ker.i)))) {
          aStack_250.cfg = dist.cfg;
          dVar13 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.g,ker.d);
          dVar14 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.d,ker.a);
          dVar15 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.l,ker.i);
          dVar16 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.i,ker.f);
          dVar17 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.h,ker.e);
          dVar13 = dVar13 + dVar14 + dVar15 + dVar16 + dVar17 * 4.0;
          dVar14 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.c,ker.h);
          dVar15 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.h,ker.m);
          dVar16 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,res.blend_k,ker.e);
          dVar17 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.e,ker.j);
          dVar18 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffdb0,ker.d,ker.i);
          register0x00001200 = dVar14 + dVar15 + dVar16 + dVar17 + dVar18 * 4.0;
          if (register0x00001200 <= dVar13) {
            if (register0x00001200 < dVar13) {
              result_1.blend_j._2_1_ =
                   (dist.cfg)->dominantDirectionThreshold * register0x00001200 < dVar13;
              if (((ker.h != ker.d) && (ker.h != ker.i)) &&
                 (result.blend_f = BLEND_NORMAL, (bool)result_1.blend_j._2_1_)) {
                result.blend_f = BLEND_DOMINANT;
              }
              if (((ker.e != ker.d) && (ker.e != ker.i)) &&
                 (uStack_230 = 1, (bool)result_1.blend_j._2_1_)) {
                uStack_230 = 2;
              }
            }
          }
          else {
            result_1.blend_j._3_1_ =
                 (dist.cfg)->dominantDirectionThreshold * dVar13 < register0x00001200;
            if (((ker.d != ker.e) && (ker.d != ker.h)) &&
               (local_234 = 1, (bool)result_1.blend_j._3_1_)) {
              local_234 = 2;
            }
            if (((ker.i != ker.h) && (ker.i != ker.e)) &&
               (result.blend_g = BLEND_NORMAL, (bool)result_1.blend_j._3_1_)) {
              result.blend_g = BLEND_DOMINANT;
            }
          }
        }
        uStack_3a8 = CONCAT44(uStack_230,local_234);
        res.blend_g = result.blend_g;
        res.blend_f = result.blend_f;
        setTopR(_y + local_334,result.blend_f);
        if (local_334 + 1 < cfg_local._4_4_) {
          setTopL(_y + (local_334 + 1),res.blend_g);
        }
      }
    }
    for (out._4_4_ = trgWidth; puVar3 = trg_local, iVar1 = cfg_local._4_4_, out._4_4_ < yLast;
        out._4_4_ = out._4_4_ + 1) {
      s_m1_1 = _srcHeight_local + out._4_4_ * 3 * preProcBuffer._4_4_;
      s_0_1._4_4_ = out._4_4_ + -1;
      s_0_1._0_4_ = 0;
      piVar11 = std::max<int>((int *)((long)&s_0_1 + 4),(int *)&s_0_1);
      puVar6 = trg_local;
      iVar5 = cfg_local._4_4_;
      local_3c0 = puVar3 + iVar1 * *piVar11;
      s_p1_1 = trg_local + cfg_local._4_4_ * out._4_4_;
      s_p2_1._4_4_ = out._4_4_ + 1;
      s_p2_1._0_4_ = (int)cfg_local + -1;
      piVar11 = std::min<int>((int *)((long)&s_p2_1 + 4),(int *)&s_p2_1);
      puVar3 = trg_local;
      iVar1 = cfg_local._4_4_;
      local_3d8 = puVar6 + iVar5 * *piVar11;
      iStack_3ec = out._4_4_ + 2;
      x_1 = (int)cfg_local + -1;
      piVar11 = std::min<int>(&stack0xfffffffffffffc14,&x_1);
      local_3e8 = puVar3 + iVar1 * *piVar11;
      x_m1_1._3_1_ = '\0';
      for (local_3f8 = 0; local_3f8 < cfg_local._4_4_; local_3f8 = local_3f8 + 1) {
        local_535 = (anonymous_namespace)::debugPixelX == local_3f8 &&
                    (anonymous_namespace)::debugPixelY == out._4_4_;
        (anonymous_namespace)::breakIntoDebugger = local_535;
        x_p1_1 = local_3f8 + -1;
        local_404 = 0;
        piVar11 = std::max<int>(&x_p1_1,&local_404);
        local_3fc = *piVar11;
        x_p2_1 = local_3f8 + 1;
        local_410 = cfg_local._4_4_ + -1;
        piVar11 = std::min<int>(&x_p2_1,&local_410);
        local_408 = *piVar11;
        iStack_418 = local_3f8 + 2;
        ker_1.p = cfg_local._4_4_ - 1;
        piVar11 = std::min<int>(&stack0xfffffffffffffbe8,(int *)&ker_1.p);
        local_414 = *piVar11;
        ker_1.o._3_1_ = 0;
        memset(&res_1.blend_j,0,0x40);
        res_1.blend_j = local_3c0[local_3fc];
        res_1.blend_k = local_3c0[local_3f8];
        ker_1.a = local_3c0[local_408];
        ker_1.b = local_3c0[local_414];
        ker_1.c = s_p1_1[local_3fc];
        ker_1.d = s_p1_1[local_3f8];
        ker_1.e = s_p1_1[local_408];
        ker_1.f = s_p1_1[local_414];
        ker_1.g = local_3d8[local_3fc];
        ker_1.h = local_3d8[local_3f8];
        ker_1.i = local_3d8[local_408];
        ker_1.j = local_3d8[local_414];
        ker_1.k = local_3e8[local_3fc];
        ker_1.l = local_3e8[local_3f8];
        ker_1.m = local_3e8[local_408];
        ker_1.n = local_3e8[local_414];
        dist_1.cfg = pSStack_2d8;
        memset(&local_27c,0,0x10);
        if (((ker_1.d != ker_1.e) || (ker_1.h != ker_1.i)) &&
           ((ker_1.d != ker_1.h || (ker_1.e != ker_1.i)))) {
          aStack_298.cfg = dist_1.cfg;
          jg_1._4_4_ = 4;
          dVar13 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.g,ker_1.d);
          dVar14 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.d,ker_1.a);
          dVar15 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.l,ker_1.i);
          dVar16 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.i,ker_1.f);
          dVar17 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.h,ker_1.e);
          fk_1 = dVar13 + dVar14 + dVar15 + dVar16 + dVar17 * 4.0;
          dVar13 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.c,ker_1.h);
          dVar14 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.h,ker_1.m);
          dVar15 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,res_1.blend_k,ker_1.e);
          dVar16 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.e,ker_1.j);
          dVar17 = preProcessCorners::anon_class_8_1_ba1d3bc4::operator()
                             (&stack0xfffffffffffffd68,ker_1.d,ker_1.i);
          dStack_2b0 = dVar13 + dVar14 + dVar15 + dVar16 + dVar17 * 4.0;
          if (dStack_2b0 <= fk_1) {
            if (dStack_2b0 < fk_1) {
              src_local._6_1_ = (dist_1.cfg)->dominantDirectionThreshold * dStack_2b0 < fk_1;
              if (((ker_1.h != ker_1.d) && (ker_1.h != ker_1.i)) &&
                 (result_1.blend_f = BLEND_NORMAL, (bool)src_local._6_1_)) {
                result_1.blend_f = BLEND_DOMINANT;
              }
              if (((ker_1.e != ker_1.d) && (ker_1.e != ker_1.i)) &&
                 (uStack_278 = 1, (bool)src_local._6_1_)) {
                uStack_278 = 2;
              }
            }
          }
          else {
            src_local._7_1_ = (dist_1.cfg)->dominantDirectionThreshold * fk_1 < dStack_2b0;
            if (((ker_1.d != ker_1.e) && (ker_1.d != ker_1.h)) &&
               (local_27c = BLEND_NORMAL, (bool)src_local._7_1_)) {
              local_27c = BLEND_DOMINANT;
            }
            if (((ker_1.i != ker_1.h) && (ker_1.i != ker_1.e)) &&
               (result_1.blend_g = BLEND_NORMAL, (bool)src_local._7_1_)) {
              result_1.blend_g = BLEND_DOMINANT;
            }
          }
        }
        ker_2.i = uStack_278;
        ker_2.h = local_27c;
        res_1.blend_g = result_1.blend_g;
        res_1.blend_f = result_1.blend_f;
        ker_1.o._3_1_ = _y[local_3f8];
        setBottomR((uchar *)((long)&ker_1.o + 3),local_27c);
        setTopR((uchar *)((long)&x_m1_1 + 3),res_1.blend_f);
        _y[local_3f8] = x_m1_1._3_1_;
        x_m1_1._3_1_ = '\0';
        setTopL((uchar *)((long)&x_m1_1 + 3),res_1.blend_g);
        if (local_3f8 + 1 < cfg_local._4_4_) {
          setBottomL(_y + (local_3f8 + 1),ker_2.i);
        }
        fillBlock(s_m1_1,preProcBuffer._4_4_ << 2,s_p1_1[local_3f8],3);
        bVar7 = blendingNeeded(ker_1.o._3_1_);
        if (bVar7) {
          memset(local_494,0,0x24);
          pSVar4 = pSStack_2d8;
          iVar1 = preProcBuffer._4_4_;
          puVar3 = s_m1_1;
          local_494._0_4_ = local_3c0[local_3fc];
          local_494._4_4_ = local_3c0[local_3f8];
          ker_2.a = local_3c0[local_408];
          ker_2.b = s_p1_1[local_3fc];
          ker_2.c = s_p1_1[local_3f8];
          ker_2.d = s_p1_1[local_408];
          ker_2.e = local_3d8[local_3fc];
          ker_2.f = local_3d8[local_3f8];
          ker_2.g = local_3d8[local_408];
          if (((anonymous_namespace)::breakIntoDebugger & 1) != 0) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          eq.cfg._7_1_ = rotateBlendInfo<((anonymous_namespace)::RotationDegree)0>(ker_1.o._3_1_);
          BVar8 = getBottomR(eq.cfg._7_1_);
          if (0 < (int)BVar8) {
            dist_2.cfg = pSVar4;
            aStack_1d8.cfg = pSVar4;
            _auStack_1f8 = (uchar *)((long)&eq.cfg + 7);
            local_1f0 = &dist_2;
            local_1e8 = (Kernel_3x3 *)local_494;
            local_1d9 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)0>
                        ::anon_class_24_3_f7eba986::operator()
                                  ((anon_class_24_3_f7eba986 *)auStack_1f8);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
            uVar10 = get_f<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
            dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)0>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffe28,uVar9,uVar10);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
            uVar10 = get_h<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
            dVar14 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)0>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffe28,uVar9,uVar10);
            if (dVar14 < dVar13) {
              local_58c = get_h<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
            }
            else {
              local_58c = get_f<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
            }
            out_1._12_4_ = local_58c;
            OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0>::OutputMatrix
                      ((OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0> *)&fg,puVar3,
                       iVar1);
            if ((local_1d9 & 1) == 0) {
              Scaler3x::
              blendCorner<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0>_>
                        (out_1._12_4_,
                         (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0> *)&fg);
            }
            else {
              uVar9 = get_f<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
              uVar10 = get_g<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
              dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)0>
                       ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffe28,uVar9,uVar10);
              uVar9 = get_h<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
              uVar10 = get_c<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
              register0x00001200 =
                   scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)0>
                   ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffe28,uVar9,uVar10);
              local_58d = false;
              if (pSVar4->steepDirectionThreshold * dVar13 <= register0x00001200) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                uVar10 = get_g<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                local_58d = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_d<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                  uVar10 = get_g<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                  local_58d = uVar9 != uVar10;
                }
              }
              result.blend_j._3_1_ = local_58d;
              local_5a1 = false;
              if (pSVar4->steepDirectionThreshold * stack0xfffffffffffffde0 <= dVar13) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                uVar10 = get_c<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                local_5a1 = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_b<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                  uVar10 = get_c<((anonymous_namespace)::RotationDegree)0>((Kernel_3x3 *)local_494);
                  local_5a1 = uVar9 != uVar10;
                }
              }
              result.blend_j._2_1_ = local_5a1;
              if ((result.blend_j._3_1_ & 1) == BLEND_NONE >> 0x18) {
                if (local_5a1 == false) {
                  Scaler3x::
                  blendLineDiagonal<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0>_>
                            (out_1._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0> *)&fg);
                }
                else {
                  Scaler3x::
                  blendLineSteep<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0>_>
                            (out_1._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0> *)&fg);
                }
              }
              else if (local_5a1 == false) {
                Scaler3x::
                blendLineShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0>_>
                          (out_1._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0> *)&fg);
              }
              else {
                Scaler3x::
                blendLineSteepAndShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0>_>
                          (out_1._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)0> *)&fg);
              }
            }
          }
          pSVar4 = pSStack_2d8;
          iVar1 = preProcBuffer._4_4_;
          puVar3 = s_m1_1;
          if (((anonymous_namespace)::breakIntoDebugger & 1) != 0) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          eq_1.cfg._7_1_ = rotateBlendInfo<((anonymous_namespace)::RotationDegree)1>(ker_1.o._3_1_);
          BVar8 = getBottomR(eq_1.cfg._7_1_);
          if (0 < (int)BVar8) {
            dist_3.cfg = pSVar4;
            aStack_150.cfg = pSVar4;
            _auStack_170 = (uchar *)((long)&eq_1.cfg + 7);
            local_168 = &dist_3;
            local_160 = (Kernel_3x3 *)local_494;
            local_151 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)1>
                        ::anon_class_24_3_f7eba986::operator()
                                  ((anon_class_24_3_f7eba986 *)auStack_170);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
            uVar10 = get_f<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
            dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)1>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffeb0,uVar9,uVar10);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
            uVar10 = get_h<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
            dVar14 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)1>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffeb0,uVar9,uVar10);
            if (dVar14 < dVar13) {
              local_5c4 = get_h<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
            }
            else {
              local_5c4 = get_f<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
            }
            out_2._12_4_ = local_5c4;
            OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1>::OutputMatrix
                      ((OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1> *)&fg_1,puVar3,
                       iVar1);
            if ((local_151 & 1) == 0) {
              Scaler3x::
              blendCorner<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1>_>
                        (out_2._12_4_,
                         (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1> *)&fg_1);
            }
            else {
              uVar9 = get_f<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
              uVar10 = get_g<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
              dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)1>
                       ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffeb0,uVar9,uVar10);
              uVar9 = get_h<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
              uVar10 = get_c<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
              dVar14 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)1>
                       ::anon_class_8_1_ba1d3bc4::operator()(&stack0xfffffffffffffeb0,uVar9,uVar10);
              bVar7 = false;
              if (pSVar4->steepDirectionThreshold * dVar13 <= dVar14) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                uVar10 = get_g<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                bVar7 = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_d<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                  uVar10 = get_g<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                  bVar7 = uVar9 != uVar10;
                }
              }
              bVar12 = false;
              if (pSVar4->steepDirectionThreshold * dVar14 <= dVar13) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                uVar10 = get_c<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                bVar12 = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_b<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                  uVar10 = get_c<((anonymous_namespace)::RotationDegree)1>((Kernel_3x3 *)local_494);
                  bVar12 = uVar9 != uVar10;
                }
              }
              if (bVar7) {
                if (bVar12) {
                  Scaler3x::
                  blendLineSteepAndShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1>_>
                            (out_2._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1> *)&fg_1);
                }
                else {
                  Scaler3x::
                  blendLineShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1>_>
                            (out_2._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1> *)&fg_1);
                }
              }
              else if (bVar12) {
                Scaler3x::
                blendLineSteep<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1>_>
                          (out_2._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1> *)&fg_1);
              }
              else {
                Scaler3x::
                blendLineDiagonal<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1>_>
                          (out_2._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)1> *)&fg_1);
              }
            }
          }
          pSVar4 = pSStack_2d8;
          iVar1 = preProcBuffer._4_4_;
          puVar3 = s_m1_1;
          if (((anonymous_namespace)::breakIntoDebugger & 1) != 0) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          eq_2.cfg._7_1_ = rotateBlendInfo<((anonymous_namespace)::RotationDegree)2>(ker_1.o._3_1_);
          BVar8 = getBottomR(eq_2.cfg._7_1_);
          if (0 < (int)BVar8) {
            dist_4.cfg = pSVar4;
            aStack_c8.cfg = pSVar4;
            _auStack_e8 = (uchar *)((long)&eq_2.cfg + 7);
            local_e0 = &dist_4;
            local_d8 = (Kernel_3x3 *)local_494;
            local_c9 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)2>
                       ::anon_class_24_3_f7eba986::operator()
                                 ((anon_class_24_3_f7eba986 *)auStack_e8);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
            uVar10 = get_f<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
            dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)2>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffff38,uVar9,uVar10);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
            uVar10 = get_h<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
            dVar14 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)2>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffff38,uVar9,uVar10);
            if (dVar14 < dVar13) {
              local_5fc = get_h<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
            }
            else {
              local_5fc = get_f<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
            }
            out_3._12_4_ = local_5fc;
            OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2>::OutputMatrix
                      ((OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2> *)&fg_2,puVar3,
                       iVar1);
            if ((local_c9 & 1) == 0) {
              Scaler3x::
              blendCorner<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2>_>
                        (out_3._12_4_,
                         (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2> *)&fg_2);
            }
            else {
              uVar9 = get_f<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
              uVar10 = get_g<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
              dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)2>
                       ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffff38,uVar9,uVar10);
              uVar9 = get_h<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
              uVar10 = get_c<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
              dVar14 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)2>
                       ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffff38,uVar9,uVar10);
              bVar7 = false;
              if (pSVar4->steepDirectionThreshold * dVar13 <= dVar14) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                uVar10 = get_g<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                bVar7 = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_d<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                  uVar10 = get_g<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                  bVar7 = uVar9 != uVar10;
                }
              }
              bVar12 = false;
              if (pSVar4->steepDirectionThreshold * dVar14 <= dVar13) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                uVar10 = get_c<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                bVar12 = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_b<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                  uVar10 = get_c<((anonymous_namespace)::RotationDegree)2>((Kernel_3x3 *)local_494);
                  bVar12 = uVar9 != uVar10;
                }
              }
              if (bVar7) {
                if (bVar12) {
                  Scaler3x::
                  blendLineSteepAndShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2>_>
                            (out_3._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2> *)&fg_2);
                }
                else {
                  Scaler3x::
                  blendLineShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2>_>
                            (out_3._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2> *)&fg_2);
                }
              }
              else if (bVar12) {
                Scaler3x::
                blendLineSteep<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2>_>
                          (out_3._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2> *)&fg_2);
              }
              else {
                Scaler3x::
                blendLineDiagonal<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2>_>
                          (out_3._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)2> *)&fg_2);
              }
            }
          }
          pSVar4 = pSStack_2d8;
          iVar1 = preProcBuffer._4_4_;
          puVar3 = s_m1_1;
          if (((anonymous_namespace)::breakIntoDebugger & 1) != 0) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          eq_3.cfg._7_1_ = rotateBlendInfo<((anonymous_namespace)::RotationDegree)3>(ker_1.o._3_1_);
          BVar8 = getBottomR(eq_3.cfg._7_1_);
          if (0 < (int)BVar8) {
            dist_5.cfg = pSVar4;
            aStack_40.cfg = pSVar4;
            _auStack_60 = (uchar *)((long)&eq_3.cfg + 7);
            local_58 = &dist_5;
            local_50 = (Kernel_3x3 *)local_494;
            local_41 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)3>
                       ::anon_class_24_3_f7eba986::operator()
                                 ((anon_class_24_3_f7eba986 *)auStack_60);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
            uVar10 = get_f<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
            dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)3>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffffc0,uVar9,uVar10);
            uVar9 = get_e<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
            uVar10 = get_h<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
            dVar14 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)3>
                     ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffffc0,uVar9,uVar10);
            if (dVar14 < dVar13) {
              local_634 = get_h<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
            }
            else {
              local_634 = get_f<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
            }
            out_4._12_4_ = local_634;
            OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3>::OutputMatrix
                      ((OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3> *)&fg_3,puVar3,
                       iVar1);
            if ((local_41 & 1) == 0) {
              Scaler3x::
              blendCorner<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3>_>
                        (out_4._12_4_,
                         (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3> *)&fg_3);
            }
            else {
              uVar9 = get_f<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
              uVar10 = get_g<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
              dVar13 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)3>
                       ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffffc0,uVar9,uVar10);
              uVar9 = get_h<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
              uVar10 = get_c<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
              dVar14 = scalePixel<(anonymous_namespace)::Scaler3x,_((anonymous_namespace)::RotationDegree)3>
                       ::anon_class_8_1_ba1d3bc4::operator()(&stack0xffffffffffffffc0,uVar9,uVar10);
              bVar7 = false;
              if (pSVar4->steepDirectionThreshold * dVar13 <= dVar14) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                uVar10 = get_g<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                bVar7 = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_d<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                  uVar10 = get_g<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                  bVar7 = uVar9 != uVar10;
                }
              }
              bVar12 = false;
              if (pSVar4->steepDirectionThreshold * dVar14 <= dVar13) {
                uVar9 = get_e<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                uVar10 = get_c<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                bVar12 = false;
                if (uVar9 != uVar10) {
                  uVar9 = get_b<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                  uVar10 = get_c<((anonymous_namespace)::RotationDegree)3>((Kernel_3x3 *)local_494);
                  bVar12 = uVar9 != uVar10;
                }
              }
              if (bVar7) {
                if (bVar12) {
                  Scaler3x::
                  blendLineSteepAndShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3>_>
                            (out_4._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3> *)&fg_3);
                }
                else {
                  Scaler3x::
                  blendLineShallow<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3>_>
                            (out_4._12_4_,
                             (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3> *)&fg_3);
                }
              }
              else if (bVar12) {
                Scaler3x::
                blendLineSteep<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3>_>
                          (out_4._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3> *)&fg_3);
              }
              else {
                Scaler3x::
                blendLineDiagonal<(anonymous_namespace)::OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3>_>
                          (out_4._12_4_,
                           (OutputMatrix<3UL,_((anonymous_namespace)::RotationDegree)3> *)&fg_3);
              }
            }
          }
        }
        s_m1_1 = s_m1_1 + 3;
      }
    }
  }
  return;
}

Assistant:

void scaleImage(const uint32_t* src, uint32_t* trg, int srcWidth, int srcHeight, const xbrz_old::ScalerCfg& cfg, int yFirst, int yLast)
{
    yFirst = std::max(yFirst, 0);
    yLast  = std::min(yLast, srcHeight);
    if (yFirst >= yLast || srcWidth <= 0)
        return;

    const int trgWidth = srcWidth * Scaler::scale;

    //"use" space at the end of the image as temporary buffer for "on the fly preprocessing": we even could use larger area of
    //"sizeof(uint32_t) * srcWidth * (yLast - yFirst)" bytes without risk of accidental overwriting before accessing
    const int bufferSize = srcWidth;
    unsigned char* preProcBuffer = reinterpret_cast<unsigned char*>(trg + yLast * Scaler::scale * trgWidth) - bufferSize;
    std::fill(preProcBuffer, preProcBuffer + bufferSize, 0);
#ifdef XBRZ_CXX11
    static_assert(BLEND_NONE == 0, "");
#endif // XBRZ_CXX11

    //initialize preprocessing buffer for first row: detect upper left and right corner blending
    //this cannot be optimized for adjacent processing stripes; we must not allow for a memory race condition!
    if (yFirst > 0)
    {
        const int y = yFirst - 1;

        const uint32_t* s_m1 = src + srcWidth * std::max(y - 1, 0);
        const uint32_t* s_0  = src + srcWidth * y; //center line
        const uint32_t* s_p1 = src + srcWidth * std::min(y + 1, srcHeight - 1);
        const uint32_t* s_p2 = src + srcWidth * std::min(y + 2, srcHeight - 1);

        for (int x = 0; x < srcWidth; ++x)
        {
            const int x_m1 = std::max(x - 1, 0);
            const int x_p1 = std::min(x + 1, srcWidth - 1);
            const int x_p2 = std::min(x + 2, srcWidth - 1);

            Kernel_4x4 ker = {}; //perf: initialization is negligable
            ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
            ker.b = s_m1[x];
            ker.c = s_m1[x_p1];
            ker.d = s_m1[x_p2];

            ker.e = s_0[x_m1];
            ker.f = s_0[x];
            ker.g = s_0[x_p1];
            ker.h = s_0[x_p2];

            ker.i = s_p1[x_m1];
            ker.j = s_p1[x];
            ker.k = s_p1[x_p1];
            ker.l = s_p1[x_p2];

            ker.m = s_p2[x_m1];
            ker.n = s_p2[x];
            ker.o = s_p2[x_p1];
            ker.p = s_p2[x_p2];

            const BlendResult res = preProcessCorners(ker, cfg);
            /*
            preprocessing blend result:
            ---------
            | F | G |   //evalute corner between F, G, J, K
            ----|---|   //input pixel is at position F
            | J | K |
            ---------
            */
            setTopR(preProcBuffer[x], res.blend_j);

            if (x + 1 < srcWidth)
                setTopL(preProcBuffer[x + 1], res.blend_k);
        }
    }
    //------------------------------------------------------------------------------------

    for (int y = yFirst; y < yLast; ++y)
    {
        uint32_t* out = trg + Scaler::scale * y * trgWidth; //consider MT "striped" access

        const uint32_t* s_m1 = src + srcWidth * std::max(y - 1, 0);
        const uint32_t* s_0  = src + srcWidth * y; //center line
        const uint32_t* s_p1 = src + srcWidth * std::min(y + 1, srcHeight - 1);
        const uint32_t* s_p2 = src + srcWidth * std::min(y + 2, srcHeight - 1);

        unsigned char blend_xy1 = 0; //corner blending for current (x, y + 1) position

        for (int x = 0; x < srcWidth; ++x, out += Scaler::scale)
        {
#ifndef NDEBUG
            breakIntoDebugger = debugPixelX == x && debugPixelY == y;
#endif
            //all those bounds checks have only insignificant impact on performance!
            const int x_m1 = std::max(x - 1, 0); //perf: prefer array indexing to additional pointers!
            const int x_p1 = std::min(x + 1, srcWidth - 1);
            const int x_p2 = std::min(x + 2, srcWidth - 1);

            //evaluate the four corners on bottom-right of current pixel
            unsigned char blend_xy = 0; //for current (x, y) position
            {
                Kernel_4x4 ker = {}; //perf: initialization is negligable
                ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
                ker.b = s_m1[x];
                ker.c = s_m1[x_p1];
                ker.d = s_m1[x_p2];

                ker.e = s_0[x_m1];
                ker.f = s_0[x];
                ker.g = s_0[x_p1];
                ker.h = s_0[x_p2];

                ker.i = s_p1[x_m1];
                ker.j = s_p1[x];
                ker.k = s_p1[x_p1];
                ker.l = s_p1[x_p2];

                ker.m = s_p2[x_m1];
                ker.n = s_p2[x];
                ker.o = s_p2[x_p1];
                ker.p = s_p2[x_p2];

                const BlendResult res = preProcessCorners(ker, cfg);
                /*
                preprocessing blend result:
                ---------
                | F | G |   //evalute corner between F, G, J, K
                ----|---|   //current input pixel is at position F
                | J | K |
                ---------
                */
                blend_xy = preProcBuffer[x];
                setBottomR(blend_xy, res.blend_f); //all four corners of (x, y) have been determined at this point due to processing sequence!

                setTopR(blend_xy1, res.blend_j); //set 2nd known corner for (x, y + 1)
                preProcBuffer[x] = blend_xy1; //store on current buffer position for use on next row

                blend_xy1 = 0;
                setTopL(blend_xy1, res.blend_k); //set 1st known corner for (x + 1, y + 1) and buffer for use on next column

                if (x + 1 < srcWidth) //set 3rd known corner for (x + 1, y)
                    setBottomL(preProcBuffer[x + 1], res.blend_g);
            }

            //fill block of size scale * scale with the given color
            fillBlock(out, trgWidth * sizeof(uint32_t), s_0[x], Scaler::scale); //place *after* preprocessing step, to not overwrite the results while processing the the last pixel!

            //blend four corners of current pixel
            if (blendingNeeded(blend_xy)) //good 20% perf-improvement
            {
                Kernel_3x3 ker = {}; //perf: initialization is negligable

                ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
                ker.b = s_m1[x];
                ker.c = s_m1[x_p1];

                ker.d = s_0[x_m1];
                ker.e = s_0[x];
                ker.f = s_0[x_p1];

                ker.g = s_p1[x_m1];
                ker.h = s_p1[x];
                ker.i = s_p1[x_p1];

                scalePixel<Scaler, ROT_0  >(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_90 >(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_180>(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_270>(ker, out, trgWidth, blend_xy, cfg);
            }
        }
    }
}